

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_context * secp256k1_context_clone(secp256k1_context *ctx)

{
  secp256k1_context *__dest;
  secp256k1_ge_storage_0_ *psVar1;
  
  psVar1 = (ctx->ecmult_ctx).pre_g;
  __dest = (secp256k1_context *)
           malloc((ulong)(psVar1 != (secp256k1_ge_storage_0_ *)0x0) << 0x13 | 0xe0);
  if (__dest == (secp256k1_context *)0x0) {
    (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
    psVar1 = (ctx->ecmult_ctx).pre_g;
  }
  memcpy(__dest,ctx,(ulong)(psVar1 != (secp256k1_ge_storage_0_ *)0x0) << 0x13 | 0xe0);
  if (psVar1 != (secp256k1_ge_storage_0_ *)0x0) {
    (__dest->ecmult_ctx).pre_g =
         (secp256k1_ge_storage_0_ *)((long)__dest + ((long)psVar1 - (long)ctx));
  }
  return __dest;
}

Assistant:

secp256k1_context* secp256k1_context_clone(const secp256k1_context* ctx) {
    secp256k1_context* ret;
    size_t prealloc_size;

    VERIFY_CHECK(ctx != NULL);
    prealloc_size = secp256k1_context_preallocated_clone_size(ctx);
    ret = (secp256k1_context*)checked_malloc(&ctx->error_callback, prealloc_size);
    ret = secp256k1_context_preallocated_clone(ctx, ret);
    return ret;
}